

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveMultiChannelEXRToFile(EXRImage *exrImage,char *filename,char **err)

{
  size_t __n;
  size_t mem_size;
  uchar *mem;
  FILE *fp;
  char **err_local;
  char *filename_local;
  EXRImage *exrImage_local;
  
  if ((exrImage == (EXRImage *)0x0) || (filename == (char *)0x0)) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    exrImage_local._4_4_ = -1;
  }
  else {
    fp = (FILE *)err;
    err_local = (char **)filename;
    filename_local = (char *)exrImage;
    mem = (uchar *)fopen(filename,"wb");
    if ((FILE *)mem == (FILE *)0x0) {
      if (fp != (FILE *)0x0) {
        *(char **)fp = "Cannot write a file.";
      }
      exrImage_local._4_4_ = -1;
    }
    else {
      mem_size = 0;
      __n = SaveMultiChannelEXRToMemory((EXRImage *)filename_local,(uchar **)&mem_size,(char **)fp);
      if ((__n != 0) && (mem_size != 0)) {
        fwrite((void *)mem_size,1,__n,(FILE *)mem);
      }
      free((void *)mem_size);
      fclose((FILE *)mem);
      exrImage_local._4_4_ = 0;
    }
  }
  return exrImage_local._4_4_;
}

Assistant:

int SaveMultiChannelEXRToFile(const EXRImage *exrImage, const char *filename,
                              const char **err) {
  if (exrImage == NULL || filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "wb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot write a file.";
    }
    return -1;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveMultiChannelEXRToMemory(exrImage, &mem, err);

  if ((mem_size > 0) && mem) {

    fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  return 0; // OK
}